

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O0

ExprBase * EvaluateVariableDefinition(ExpressionEvalContext *ctx,ExprVariableDefinition *expression)

{
  StackFrame *expression_00;
  bool bVar1;
  StackFrame **ppSVar2;
  ExprPointerLiteral *pEVar3;
  uint *this;
  ExprBase *pEVar4;
  StackVariable local_48;
  ExprPointerLiteral *local_38;
  ExprPointerLiteral *storage;
  TypeBase *type;
  StackFrame *frame;
  ExprVariableDefinition *expression_local;
  ExpressionEvalContext *ctx_local;
  
  frame = (StackFrame *)expression;
  expression_local = (ExprVariableDefinition *)ctx;
  bVar1 = AddInstruction(ctx);
  if (bVar1) {
    ppSVar2 = SmallArray<ExpressionEvalContext::StackFrame_*,_32U>::back
                        ((SmallArray<ExpressionEvalContext::StackFrame_*,_32U> *)
                         &(expression_local->super_ExprBase).next);
    type = (TypeBase *)*ppSVar2;
    pEVar3 = FindVariableStorage((ExpressionEvalContext *)expression_local,
                                 *(VariableData **)
                                  &(((frame->variables).little[1].ptr)->super_ExprBase).typeID,true)
    ;
    if (pEVar3 == (ExprPointerLiteral *)0x0) {
      storage = *(ExprPointerLiteral **)
                 (*(long *)&(((frame->variables).little[1].ptr)->super_ExprBase).typeID + 0x20);
      local_38 = AllocateTypeStorage((ExpressionEvalContext *)expression_local,
                                     *(SynBase **)&(frame->variables).count,(TypeBase *)storage);
      if (local_38 == (ExprPointerLiteral *)0x0) {
        return (ExprBase *)0x0;
      }
      this = &type->typeID;
      ExpressionEvalContext::StackVariable::StackVariable
                (&local_48,
                 *(VariableData **)&(((frame->variables).little[1].ptr)->super_ExprBase).typeID,
                 local_38);
      SmallArray<ExpressionEvalContext::StackVariable,_32U>::push_back
                ((SmallArray<ExpressionEvalContext::StackVariable,_32U> *)this,&local_48);
    }
    if (((*(int *)&type[5].arrayTypes.head == 0) &&
        ((frame->variables).little[2].variable != (VariableData *)0x0)) &&
       (pEVar4 = Evaluate((ExpressionEvalContext *)expression_local,
                          (ExprBase *)(frame->variables).little[2].variable),
       pEVar4 == (ExprBase *)0x0)) {
      ctx_local = (ExpressionEvalContext *)0x0;
    }
    else {
      expression_00 = frame;
      pEVar4 = &ExpressionContext::get<ExprVoid>
                          ((ExpressionContext *)(expression_local->super_ExprBase)._vptr_ExprBase)->
                super_ExprBase;
      ExprVoid::ExprVoid((ExprVoid *)pEVar4,*(SynBase **)&(frame->variables).count,
                         (TypeBase *)(expression_local->super_ExprBase)._vptr_ExprBase[0x1137]);
      ctx_local = (ExpressionEvalContext *)CheckType((ExprBase *)expression_00,pEVar4);
    }
  }
  else {
    ctx_local = (ExpressionEvalContext *)0x0;
  }
  return (ExprBase *)ctx_local;
}

Assistant:

ExprBase* EvaluateVariableDefinition(ExpressionEvalContext &ctx, ExprVariableDefinition *expression)
{
	if(!AddInstruction(ctx))
		return NULL;

	ExpressionEvalContext::StackFrame *frame = ctx.stackFrames.back();

	if(FindVariableStorage(ctx, expression->variable->variable, true) == NULL)
	{
		TypeBase *type = expression->variable->variable->type;

		ExprPointerLiteral *storage = AllocateTypeStorage(ctx, expression->source, type);

		if(!storage)
			return NULL;

		frame->variables.push_back(ExpressionEvalContext::StackVariable(expression->variable->variable, storage));
	}

	if(!frame->targetYield)
	{
		if(expression->initializer)
		{
			if(!Evaluate(ctx, expression->initializer))
				return NULL;
		}
	}

	return CheckType(expression, new (ctx.ctx.get<ExprVoid>()) ExprVoid(expression->source, ctx.ctx.typeVoid));
}